

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldQueryPdu.cpp
# Opt level: O3

void __thiscall DIS::MinefieldQueryPdu::~MinefieldQueryPdu(MinefieldQueryPdu *this)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pPVar6;
  
  (this->super_MinefieldFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__MinefieldQueryPdu_001a0878;
  pPVar1 = (this->_requestedPerimeterPoints).
           super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->_requestedPerimeterPoints).
           super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar6 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      (**pPVar6->_vptr_Point)(pPVar6);
      pPVar6 = pPVar6 + 1;
    } while (pPVar6 != pPVar2);
    (this->_requestedPerimeterPoints).super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pTVar3 = (this->_sensorTypes).
           super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar4 = (this->_sensorTypes).
           super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar5 = pTVar3;
  if (pTVar4 != pTVar3) {
    do {
      (**pTVar5->_vptr_TwoByteChunk)(pTVar5);
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 != pTVar4);
    (this->_sensorTypes).super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>.
    _M_impl.super__Vector_impl_data._M_finish = pTVar3;
  }
  std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::~vector(&this->_sensorTypes);
  std::vector<DIS::Point,_std::allocator<DIS::Point>_>::~vector(&this->_requestedPerimeterPoints);
  EntityType::~EntityType(&this->_requestedMineType);
  EntityID::~EntityID(&this->_requestingEntityID);
  EntityID::~EntityID(&this->_minefieldID);
  MinefieldFamilyPdu::~MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  return;
}

Assistant:

MinefieldQueryPdu::~MinefieldQueryPdu()
{
    _requestedPerimeterPoints.clear();
    _sensorTypes.clear();
}